

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLLinOp::setDomainBC(MLLinOp *this,Array<BCType,_3> *a_lobc,Array<BCType,_3> *a_hibc)

{
  int iVar1;
  allocator_type local_52;
  allocator_type local_51;
  _Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  local_50;
  _Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  local_38;
  
  iVar1 = (*this->_vptr_MLLinOp[5])();
  std::
  vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::vector((vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            *)&local_38,(long)iVar1,a_lobc,&local_51);
  std::
  vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::vector((vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            *)&local_50,(long)iVar1,a_hibc,&local_52);
  setDomainBC(this,(Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    *)&local_38,
              (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               *)&local_50);
  std::
  _Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::~_Vector_base(&local_50);
  std::
  _Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::~_Vector_base(&local_38);
  return;
}

Assistant:

void
MLLinOp::setDomainBC (const Array<BCType,AMREX_SPACEDIM>& a_lobc,
                      const Array<BCType,AMREX_SPACEDIM>& a_hibc) noexcept
{
    const int ncomp = getNComp();
    setDomainBC(Vector<Array<BCType,AMREX_SPACEDIM> >(ncomp,a_lobc),
                Vector<Array<BCType,AMREX_SPACEDIM> >(ncomp,a_hibc));
}